

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsGetPropertyNameFromId(JsPropertyIdRef propertyId,WCHAR **name)

{
  JsErrorCode JVar1;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  JVar1 = JsErrorInvalidArgument;
  if ((propertyId != (JsPropertyIdRef)0x0) && (0xf < *(uint *)((long)propertyId + 8))) {
    if (name == (WCHAR **)0x0) {
      JVar1 = JsErrorNullArgument;
    }
    else {
      *name = (WCHAR *)0x0;
      JVar1 = JsErrorPropertyNotString;
      if (*(char *)((long)propertyId + 0x12) == '\0') {
        *name = (WCHAR *)((long)propertyId + 0x18);
        JVar1 = JsNoError;
      }
    }
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetPropertyNameFromId(_In_ JsPropertyIdRef propertyId, _Outptr_result_z_ const WCHAR **name)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_PROPERTYID(propertyId);
        PARAM_NOT_NULL(name);
        *name = nullptr;

        Js::PropertyRecord const * propertyRecord = (Js::PropertyRecord const *)propertyId;

        if (propertyRecord->IsSymbol())
        {
            return JsErrorPropertyNotString;
        }

        *name = propertyRecord->GetBuffer();
        return JsNoError;
    });
}